

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

SC_Man * Abc_SclManStart(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fUseWireLoads,int fDept,float DUser,
                        int nTreeCRatio)

{
  int *piVar1;
  char *__s;
  int iVar2;
  int iVar3;
  int iVar4;
  SC_Man *p;
  SC_Pair *pSVar5;
  Vec_Int_t *pVVar6;
  Vec_Flt_t *pVVar7;
  Vec_Que_t *pVVar8;
  Vec_Wec_t *pVVar9;
  Abc_Obj_t *pAVar10;
  SC_WireLoad *pSVar11;
  char *__dest;
  int iVar12;
  size_t sVar13;
  int iVar14;
  long lVar15;
  float Area;
  
  if (pLib->unit_time != 0xc) {
    __assert_fail("pLib->unit_time == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclSize.h"
                  ,0x98,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pLib->unit_cap_snd != 0xf) {
    __assert_fail("pLib->unit_cap_snd == 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclSize.h"
                  ,0x99,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclSize.h"
                  ,0x9a,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  p = (SC_Man *)calloc(1,0x130);
  p->pLib = pLib;
  p->pNtk = pNtk;
  iVar12 = pNtk->vObjs->nSize;
  p->nObjs = iVar12;
  sVar13 = (size_t)iVar12;
  pSVar5 = (SC_Pair *)calloc(sVar13,8);
  p->pLoads = pSVar5;
  pSVar5 = (SC_Pair *)calloc(sVar13,8);
  p->pDepts = pSVar5;
  pSVar5 = (SC_Pair *)calloc(sVar13,8);
  p->pTimes = pSVar5;
  pSVar5 = (SC_Pair *)calloc(sVar13,8);
  p->pSlews = pSVar5;
  pVVar6 = Vec_IntStart(iVar12);
  p->vBestFans = pVVar6;
  pVVar7 = Vec_FltStart(pNtk->vCos->nSize);
  p->vTimesOut = pVVar7;
  pVVar8 = Vec_QueAlloc(pNtk->vCos->nSize);
  p->vQue = pVVar8;
  Vec_QueSetPriority(pVVar8,&pVVar7->pArray);
  lVar15 = 0;
  while( true ) {
    if (pNtk->vCos->nSize <= lVar15) {
      pVVar6 = Vec_IntAlloc(1000);
      p->vUpdates = pVVar6;
      pVVar6 = Vec_IntAlloc(1000);
      p->vUpdates2 = pVVar6;
      pVVar7 = Vec_FltAlloc(1000);
      p->vLoads2 = pVVar7;
      pVVar7 = Vec_FltAlloc(1000);
      p->vLoads3 = pVVar7;
      pVVar7 = Vec_FltAlloc(1000);
      p->vTimes2 = pVVar7;
      pVVar7 = Vec_FltAlloc(1000);
      p->vTimes3 = pVVar7;
      pVVar7 = Vec_FltStart(iVar12);
      p->vNode2Gain = pVVar7;
      pVVar6 = Vec_IntStart(iVar12);
      p->vNode2Gate = pVVar6;
      pVVar8 = Vec_QueAlloc(iVar12);
      p->vNodeByGain = pVVar8;
      Vec_QueSetPriority(pVVar8,&pVVar7->pArray);
      pVVar6 = Vec_IntAlloc(iVar12);
      pVVar6->nSize = iVar12;
      memset(pVVar6->pArray,0xff,sVar13 << 2);
      p->vNodeIter = pVVar6;
      iVar4 = Abc_NtkLevel(pNtk);
      iVar12 = iVar4 * 2 + 1;
      pVVar9 = (Vec_Wec_t *)malloc(0x10);
      iVar14 = 8;
      if (6 < (uint)(iVar4 * 2)) {
        iVar14 = iVar12;
      }
      pVVar9->nCap = iVar14;
      pVVar6 = (Vec_Int_t *)calloc((long)iVar14,0x10);
      pVVar9->pArray = pVVar6;
      pVVar9->nSize = iVar12;
      p->vLevels = pVVar9;
      pVVar6 = Vec_IntAlloc(100);
      p->vChanged = pVVar6;
      for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
        pAVar10 = Abc_NtkCo(pNtk,iVar12);
        *(uint *)&pAVar10->field_0x14 =
             (*(uint *)((long)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray] + 0x14) &
             0xfffff000) + (*(uint *)&pAVar10->field_0x14 & 0xfff) + 0x1000;
      }
      for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
        pAVar10 = Abc_NtkCi(pNtk,iVar12);
        (pAVar10->field_5).iData = iVar12;
      }
      for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
        pAVar10 = Abc_NtkCo(pNtk,iVar12);
        (pAVar10->field_5).iData = iVar12;
      }
      if (nTreeCRatio != 0) {
        p->EstLoadMax = (float)nTreeCRatio * 0.01;
        p->EstLinear = 100.0;
      }
      Abc_SclMioGates2SclGates(pLib,pNtk);
      Abc_SclManReadSlewAndLoad(p,pNtk);
      if (fUseWireLoads != 0) {
        if (pNtk->pWLoadUsed == (char *)0x0) {
          Area = Abc_SclGetTotalArea(p->pNtk);
          pSVar11 = Abc_SclFindWireLoadModel(pLib,Area);
          p->pWLoadUsed = pSVar11;
          if (pSVar11 != (SC_WireLoad *)0x0) {
            __s = pSVar11->pName;
            if (__s == (char *)0x0) {
              __dest = (char *)0x0;
            }
            else {
              sVar13 = strlen(__s);
              __dest = (char *)malloc(sVar13 + 1);
              strcpy(__dest,__s);
            }
            pNtk->pWLoadUsed = __dest;
          }
        }
        else {
          pSVar11 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
          p->pWLoadUsed = pSVar11;
        }
      }
      Abc_SclTimeNtkRecompute(p,&p->SumArea0,&p->MaxDelay0,fDept,DUser);
      p->SumArea = p->SumArea0;
      p->MaxDelay = p->MaxDelay0;
      return p;
    }
    iVar14 = pVVar8->nCap;
    if (iVar14 <= pVVar8->nSize) {
      iVar2 = pVVar8->nSize + 1;
      iVar4 = iVar14 * 2;
      if (iVar14 * 2 < iVar2) {
        iVar4 = iVar2;
      }
      Vec_QueGrow(pVVar8,iVar4);
      iVar14 = pVVar8->nCap;
    }
    iVar4 = (int)lVar15;
    if (iVar14 <= lVar15) {
      iVar2 = iVar14 * 2;
      iVar3 = iVar4 + 1;
      if (iVar3 != iVar2 && SBORROW4(iVar3,iVar2) == iVar3 + iVar14 * -2 < 0) {
        iVar2 = iVar3;
      }
      Vec_QueGrow(pVVar8,iVar2);
      iVar14 = pVVar8->nCap;
    }
    iVar2 = pVVar8->nSize;
    if (iVar14 <= iVar2) {
      __assert_fail("p->nSize < p->nCap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                    ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    if (pVVar8->pOrder[lVar15] != -1) {
      __assert_fail("p->pOrder[v] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                    ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar1 = pVVar8->pHeap;
    if (piVar1[iVar2] != -1) break;
    pVVar8->pOrder[lVar15] = iVar2;
    iVar14 = pVVar8->nSize;
    pVVar8->nSize = iVar14 + 1;
    piVar1[iVar14] = iVar4;
    Vec_QueMoveUp(pVVar8,iVar4);
    lVar15 = lVar15 + 1;
  }
  __assert_fail("p->pHeap[p->nSize] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
}

Assistant:

SC_Man * Abc_SclManStart( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fUseWireLoads, int fDept, float DUser, int nTreeCRatio )
{
    SC_Man * p = Abc_SclManAlloc( pLib, pNtk );
    if ( nTreeCRatio )
    {
        p->EstLoadMax = 0.01 * nTreeCRatio;  // max ratio of Cout/Cave when the estimation is used
        p->EstLinear  = 100;                  // linear coefficient
    }
    Abc_SclMioGates2SclGates( pLib, pNtk );
    Abc_SclManReadSlewAndLoad( p, pNtk );
    if ( fUseWireLoads )
    {
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(p->pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    Abc_SclTimeNtkRecompute( p, &p->SumArea0, &p->MaxDelay0, fDept, DUser );
    p->SumArea  = p->SumArea0;
    p->MaxDelay = p->MaxDelay0;
    return p;
}